

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::Export_Material(X3DExporter *this,size_t pIdxMaterial,size_t pTabLevel)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  ulong uVar3;
  aiMaterial *pMat;
  bool bVar4;
  float fVar5;
  size_t pTabLevel_00;
  char cVar6;
  aiReturn aVar7;
  _Base_ptr p_Var8;
  undefined8 *puVar9;
  _Node *p_Var10;
  mapped_type *pmVar11;
  Logger *this_00;
  long *plVar12;
  _Base_ptr p_Var13;
  ulong uVar14;
  size_type *psVar15;
  aiVector2D *pAttrDefaultValue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  char cVar17;
  undefined8 uVar18;
  X3DExporter *pXVar19;
  _Alloc_hider _Var20;
  pointer pcVar21;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  float tvalf;
  anon_class_16_2_65aab299 Color4ToAttrList;
  aiColor4D color4;
  string material_name;
  aiColor4D c;
  aiString ai_mat_name;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_938;
  float local_91c;
  SAttribute local_918;
  undefined1 local_8d8 [8];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  *plStack_8d0;
  undefined1 local_8c8 [24];
  aiColor3D local_8b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a0;
  aiColor3D local_890;
  ulong local_880;
  float local_874;
  float local_870;
  float local_86c;
  pointer local_868;
  long local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined1 local_848 [5];
  undefined1 auStack_843 [3];
  IOStream *pIStack_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  _Alloc_hider local_828;
  char local_818 [992];
  undefined1 local_438 [32];
  _Alloc_hider local_418;
  char local_408 [984];
  
  local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
  local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
  local_938._M_impl._M_node._M_size = 0;
  p_Var8 = (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pMat = this->mScene->mMaterials[pIdxMaterial];
  local_8c8._16_8_ = pTabLevel;
  local_880 = pIdxMaterial;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_006b635e:
    pcVar21 = local_438 + 0x10;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    local_438._0_8_ = pcVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"_IDX_","");
    uVar3 = local_880;
    cVar17 = '\x01';
    if (9 < local_880) {
      uVar14 = local_880;
      cVar6 = '\x04';
      do {
        cVar17 = cVar6;
        if (uVar14 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_006b64ef;
        }
        if (uVar14 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_006b64ef;
        }
        if (uVar14 < 10000) goto LAB_006b64ef;
        bVar4 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar6 = cVar17 + '\x04';
      } while (bVar4);
      cVar17 = cVar17 + '\x01';
    }
LAB_006b64ef:
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct((ulong)local_848,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>(_local_848,(uint)pIStack_840._0_4_,uVar3);
    uVar3 = (long)&pIStack_840->_vptr_IOStream + local_438._8_8_;
    uVar14 = 0xf;
    if ((pointer)local_438._0_8_ != pcVar21) {
      uVar14 = local_438._16_8_;
    }
    if (uVar14 < uVar3) {
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        uVar18 = local_838._M_allocated_capacity;
      }
      if ((ulong)uVar18 < uVar3) goto LAB_006b6575;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_848,0,(char *)0x0,local_438._0_8_);
    }
    else {
LAB_006b6575:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append(local_438,(ulong)_local_848);
    }
    local_868 = (pointer)&local_858;
    pcVar2 = (pointer)(puVar9 + 2);
    if ((pointer)*puVar9 == pcVar2) {
      local_858 = *(undefined8 *)pcVar2;
      uStack_850 = puVar9[3];
    }
    else {
      local_858 = *(undefined8 *)pcVar2;
      local_868 = (pointer)*puVar9;
    }
    local_860 = puVar9[1];
    *puVar9 = pcVar2;
    puVar9[1] = 0;
    *pcVar2 = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848);
    }
    if ((pointer)local_438._0_8_ != pcVar21) {
      operator_delete((void *)local_438._0_8_);
    }
    local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
    memset(local_438 + 5,0x1b,0x3ff);
    aVar7 = aiGetMaterialString(pMat,"?mat.name",0,0,(aiString *)local_438);
    if (aVar7 == aiReturn_SUCCESS) {
      strlen(local_438 + 4);
      std::__cxx11::string::replace((ulong)&local_868,0,(char *)0x0,(ulong)(local_438 + 4));
    }
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"DEF","");
    local_828._M_p = local_818;
    std::__cxx11::string::_M_construct<char*>((string *)&local_828,local_868,local_868 + local_860);
    p_Var10 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(SAttribute *)local_848);
    std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
    local_938._M_impl._M_node._M_size = local_938._M_impl._M_node._M_size + 1;
    if (local_828._M_p != local_818) {
      operator_delete(local_828._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848);
    }
    pmVar11 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->mDEF_Map_Material,&local_880);
    std::__cxx11::string::_M_assign((string *)pmVar11);
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_848,local_8c8._16_8_,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_938);
    local_938._M_impl._M_node._M_size = 0;
    local_8b0.r = 0.0;
    local_8b0.g = 0.0;
    local_8b0.b = 0.0;
    local_8d8 = (undefined1  [8])0x0;
    plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)0x0;
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    local_918.Name._M_dataplus._M_p = (pointer)this;
    local_918.Name._M_string_length = (size_type)&local_938;
    aVar7 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_848);
    if (aVar7 == aiReturn_SUCCESS) {
      pXVar19 = (X3DExporter *)local_848;
      local_86c = (float)local_848._0_4_;
      local_874 = stack0xfffffffffffff7bc;
      local_870 = pIStack_840._0_4_;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"ambientIntensity","");
      AttrHelper_FloatToAttrList
                (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,(local_86c + local_874 + local_870) / 3.0
                 ,0.2);
LAB_006b68cb:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
    }
    else {
      aVar7 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_8d8);
      if (aVar7 == aiReturn_SUCCESS) {
        pXVar19 = (X3DExporter *)local_848;
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"ambientIntensity","");
        AttrHelper_FloatToAttrList
                  (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                            *)&local_938,(string *)local_848,
                   ((float)local_8d8._0_4_ + (float)local_8d8._4_4_ + plStack_8d0._0_4_) / 3.0,0.2);
        goto LAB_006b68cb;
      }
    }
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    aVar7 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_848);
    local_8b0._0_8_ = _local_848;
    local_8b0.b = pIStack_840._0_4_;
    if (aVar7 == aiReturn_SUCCESS) {
      pXVar19 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"diffuseColor","");
      local_890.r = 0.8;
      local_890.g = 0.8;
      local_890.b = 0.8;
      AttrHelper_Color3ToAttrList
                (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,&local_8b0,&local_890);
LAB_006b69ec:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
    }
    else {
      aVar7 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_8d8);
      if (aVar7 == aiReturn_SUCCESS) {
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"diffuseColor","");
        local_890.r = 0.8;
        local_890.g = 0.8;
        local_890.b = 0.8;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_890);
        goto LAB_006b69ec;
      }
    }
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    aVar7 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_848);
    local_8b0._0_8_ = _local_848;
    local_8b0.b = pIStack_840._0_4_;
    if (aVar7 == aiReturn_SUCCESS) {
      pXVar19 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"emissiveColor","");
      local_890.r = 0.0;
      local_890.g = 0.0;
      local_890.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,&local_8b0,&local_890);
LAB_006b6b02:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
    }
    else {
      aVar7 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_8d8);
      if (aVar7 == aiReturn_SUCCESS) {
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"emissiveColor","");
        local_890.r = 0.0;
        local_890.g = 0.0;
        local_890.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_890);
        goto LAB_006b6b02;
      }
    }
    aVar7 = aiGetMaterialFloatArray(pMat,"$mat.shininess",0,0,&local_91c,(uint *)0x0);
    if (aVar7 == aiReturn_SUCCESS) {
      pXVar19 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"shininess","");
      AttrHelper_FloatToAttrList
                (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,local_91c,0.2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
    }
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    aVar7 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_848);
    local_8b0._0_8_ = _local_848;
    local_8b0.b = pIStack_840._0_4_;
    if (aVar7 == aiReturn_SUCCESS) {
      pXVar19 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"specularColor","");
      local_890.r = 0.0;
      local_890.g = 0.0;
      local_890.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,&local_8b0,&local_890);
LAB_006b6c85:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
    }
    else {
      aVar7 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_8d8);
      if (aVar7 == aiReturn_SUCCESS) {
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"specularColor","");
        local_890.r = 0.0;
        local_890.g = 0.0;
        local_890.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_890);
        goto LAB_006b6c85;
      }
    }
    aVar7 = aiGetMaterialFloatArray(pMat,"$mat.opacity",0,0,&local_91c,(uint *)0x0);
    if (aVar7 == aiReturn_SUCCESS) {
      fVar5 = 1.0;
      if (local_91c <= 1.0) {
        fVar5 = local_91c;
      }
      local_91c = 1.0 - fVar5;
      pXVar19 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"transparency","");
      AttrHelper_FloatToAttrList
                (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,local_91c,0.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
    }
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Material","");
    pTabLevel_00 = local_8c8._16_8_ + 1;
    NodeHelper_OpenNode(this,(string *)local_848,pTabLevel_00,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_938);
    local_938._M_impl._M_node._M_size = 0;
    _local_848 = _local_848 & 0xffffff0000000000;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    memset(local_848 + 5,0x1b,0x3ff);
    aVar7 = aiGetMaterialString(pMat,"$tex.file",1,0,(aiString *)local_848);
    if (aVar7 == aiReturn_SUCCESS) {
      if (local_848[4] == '*') {
        paVar16 = &local_918.Name.field_2;
        local_918.Name._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_918,"Embedded texture is not supported","");
        this_00 = DefaultLogger::get();
        Logger::error(this_00,local_918.Name._M_dataplus._M_p);
        _Var20._M_p = local_918.Name._M_dataplus._M_p;
      }
      else {
        local_918.Name._M_dataplus._M_p = (pointer)&local_918.Name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"url","");
        local_8b0._0_8_ = &local_8a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"\"","");
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_8b0);
        local_8d8 = (undefined1  [8])local_8c8;
        pXVar19 = (X3DExporter *)(plVar12 + 2);
        if ((X3DExporter *)*plVar12 == pXVar19) {
          local_8c8._0_8_ = pXVar19->mScene;
          local_8c8._8_8_ = plVar12[3];
        }
        else {
          local_8c8._0_8_ = pXVar19->mScene;
          local_8d8 = (undefined1  [8])*plVar12;
        }
        plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)plVar12[1];
        *plVar12 = (long)pXVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append(local_8d8);
        paVar16 = &local_918.Value.field_2;
        psVar15 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_918.Value.field_2._M_allocated_capacity = *psVar15;
          local_918.Value.field_2._8_8_ = plVar12[3];
          local_918.Value._M_dataplus._M_p = (pointer)paVar16;
        }
        else {
          local_918.Value.field_2._M_allocated_capacity = *psVar15;
          local_918.Value._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_918.Value._M_string_length = plVar12[1];
        *plVar12 = (long)psVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        p_Var10 = std::__cxx11::
                  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  ::_M_create_node<Assimp::X3DExporter::SAttribute>
                            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                              *)&local_938,&local_918);
        std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
        local_938._M_impl._M_node._M_size = local_938._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Value._M_dataplus._M_p != paVar16) {
          operator_delete(local_918.Value._M_dataplus._M_p);
        }
        paVar16 = &local_8a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Name._M_dataplus._M_p != &local_918.Name.field_2) {
          operator_delete(local_918.Name._M_dataplus._M_p);
        }
        _Var20._M_p = (pointer)local_8b0._0_8_;
        if (local_8d8 != (undefined1  [8])local_8c8) {
          operator_delete((void *)local_8d8);
          _Var20._M_p = (pointer)local_8b0._0_8_;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var20._M_p != paVar16) {
        operator_delete(_Var20._M_p);
      }
    }
    aVar7 = aiGetMaterialProperty(pMat,"$tex.mapmodeu",1,0,(aiMaterialProperty **)&local_918);
    if (((aVar7 == aiReturn_SUCCESS) && (*(int *)(local_918.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)(local_918.Name._M_dataplus._M_p + 0x410) == 5)) {
      paVar16 = &local_918.Name.field_2;
      local_918.Name._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"repeatS","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_938,(string *)local_918.Name._M_dataplus._M_p,
                 SUB81(local_918.Name._M_string_length,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_918.Name._M_dataplus._M_p != paVar16) {
        operator_delete(local_918.Name._M_dataplus._M_p);
      }
    }
    aVar7 = aiGetMaterialProperty(pMat,"$tex.mapmodev",1,0,(aiMaterialProperty **)&local_918);
    if (((aVar7 == aiReturn_SUCCESS) && (*(int *)(local_918.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)(local_918.Name._M_dataplus._M_p + 0x410) == 5)) {
      paVar16 = &local_918.Name.field_2;
      local_918.Name._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"repeatT","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_938,(string *)local_918.Name._M_dataplus._M_p,
                 SUB81(local_918.Name._M_string_length,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_918.Name._M_dataplus._M_p != paVar16) {
        operator_delete(local_918.Name._M_dataplus._M_p);
      }
    }
    paVar16 = &local_918.Name.field_2;
    local_918.Name._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"ImageTexture","");
    NodeHelper_OpenNode(this,&local_918.Name,pTabLevel_00,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918.Name._M_dataplus._M_p != paVar16) {
      operator_delete(local_918.Name._M_dataplus._M_p);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_938);
    local_938._M_impl._M_node._M_size = 0;
    local_918.Name._M_dataplus._M_p = (pointer)0x0;
    local_918.Name._M_string_length = 0x3f8000003f800000;
    local_918.Name.field_2._M_allocated_capacity._0_4_ = 0.0;
    pAttrDefaultValue = (aiVector2D *)0x0;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    local_8d8 = (undefined1  [8])this;
    plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)&local_938;
    aVar7 = aiGetMaterialUVTransform(pMat,"$tex.uvtrafo",1,0,(aiUVTransform *)&local_918);
    if (aVar7 == aiReturn_SUCCESS) {
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"translation","");
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_8d8,(string *)local_848,(aiVector2D *)&local_918,
                 pAttrDefaultValue);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
      pXVar19 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar19,"rotation","");
      AttrHelper_FloatToAttrList
                (pXVar19,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,
                 (float)local_918.Name.field_2._M_allocated_capacity._0_4_,0.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"scale","");
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_8d8,(string *)local_848,
                 (aiVector2D *)&local_918.Name._M_string_length,pAttrDefaultValue);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"TextureTransform","");
      NodeHelper_OpenNode(this,(string *)local_848,pTabLevel_00,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_938);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848);
      }
      std::__cxx11::
      _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ::_M_clear(&local_938);
      local_938._M_impl._M_node._M_size = 0;
      local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
      local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    }
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_CloseNode(this,(string *)local_848,local_8c8._16_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848);
    }
    pcVar21 = local_868;
    if (local_868 == (pointer)&local_858) goto LAB_006b721c;
  }
  else {
    p_Var1 = &(this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var8 + 1) >= pIdxMaterial) {
        p_Var13 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < pIdxMaterial];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var13 == p_Var1) || (pIdxMaterial < *(ulong *)(p_Var13 + 1)))
    goto LAB_006b635e;
    pcVar2 = local_438 + 0x10;
    local_438._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"USE","");
    pmVar11 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&this->mDEF_Map_Material,&local_880);
    pcVar21 = (pmVar11->_M_dataplus)._M_p;
    local_418._M_p = local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,pcVar21,pcVar21 + pmVar11->_M_string_length);
    p_Var10 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(SAttribute *)local_438);
    std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
    local_938._M_impl._M_node._M_size = local_938._M_impl._M_node._M_size + 1;
    if (local_418._M_p != local_408) {
      operator_delete(local_418._M_p);
    }
    if ((pointer)local_438._0_8_ != pcVar2) {
      operator_delete((void *)local_438._0_8_);
    }
    local_438._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_438,local_8c8._16_8_,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    pcVar21 = (pointer)local_438._0_8_;
    if ((pointer)local_438._0_8_ == pcVar2) goto LAB_006b721c;
  }
  operator_delete(pcVar21);
LAB_006b721c:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_938);
  return;
}

Assistant:

void X3DExporter::Export_Material(const size_t pIdxMaterial, const size_t pTabLevel)
{
const char* NodeName_A = "Appearance";

list<SAttribute> attr_list;
aiMaterial& material = *mScene->mMaterials[pIdxMaterial];// create alias for conveniance.

	// Check if material already defined early.
	if(mDEF_Map_Material.find(pIdxMaterial) != mDEF_Map_Material.end())
	{
		// Material already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Material.at(pIdxMaterial)});
		NodeHelper_OpenNode(NodeName_A, pTabLevel, true, attr_list);

		return;
	}

	string material_name(string("_IDX_") + to_string(pIdxMaterial));// Create material name
	aiString ai_mat_name;

	if(material.Get(AI_MATKEY_NAME, ai_mat_name) == AI_SUCCESS) material_name.insert(0, ai_mat_name.C_Str());

	// Define material name.
	attr_list.push_back({"DEF", material_name});
	mDEF_Map_Material[pIdxMaterial] = material_name;

	//
	// "Appearance" node.
	//
	NodeHelper_OpenNode(NodeName_A, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Material" node.
	//
	{
		auto Color4ToAttrList = [&](const string& pAttrName, const aiColor4D& pAttrValue, const aiColor3D& pAttrDefaultValue)
		{
			string tstr;

			if(aiColor3D(pAttrValue.r, pAttrValue.g, pAttrValue.b) != pAttrDefaultValue)
			{
				AttrHelper_Col4DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		float tvalf;
		aiColor3D color3;
		aiColor4D color4;

		// ambientIntensity="0.2"     SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_AMBIENT, color3) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color3.r + color3.g + color3.b) / 3.0f, 0.2f);
		else if(material.Get(AI_MATKEY_COLOR_AMBIENT, color4) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color4.r + color4.g + color4.b) / 3.0f, 0.2f);

		// diffuseColor="0.8 0.8 0.8" SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "diffuseColor", color3, aiColor3D(0.8f, 0.8f, 0.8f));
		else if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color4) == AI_SUCCESS)
			Color4ToAttrList("diffuseColor", color4, aiColor3D(0.8f, 0.8f, 0.8f));

		// emissiveColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "emissiveColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color4) == AI_SUCCESS)
			Color4ToAttrList("emissiveColor", color4, aiColor3D(0, 0, 0));

		// shininess="0.2"            SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_SHININESS, tvalf) == AI_SUCCESS) AttrHelper_FloatToAttrList(attr_list, "shininess", tvalf, 0.2f);

		// specularColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_SPECULAR, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "specularColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_SPECULAR, color4) == AI_SUCCESS)
			Color4ToAttrList("specularColor", color4, aiColor3D(0, 0, 0));

		// transparency="0"           SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_OPACITY, tvalf) == AI_SUCCESS)
		{
			if(tvalf > 1) tvalf = 1;

			tvalf = 1.0f - tvalf;
			AttrHelper_FloatToAttrList(attr_list, "transparency", tvalf, 0);
		}

		NodeHelper_OpenNode("Material", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "Material" node. END.

	//
	// "ImageTexture" node.
	//
	{
		auto RepeatToAttrList = [&](const string& pAttrName, const bool pAttrValue)
		{
			if(!pAttrValue) attr_list.push_back({pAttrName, "false"});
		};

		bool tvalb;
		aiString tstring;

		// url=""         MFString
		if(material.Get(AI_MATKEY_TEXTURE_DIFFUSE(0), tstring) == AI_SUCCESS)
		{
			if(strncmp(tstring.C_Str(), AI_EMBEDDED_TEXNAME_PREFIX, strlen(AI_EMBEDDED_TEXNAME_PREFIX)) == 0)
				LogError("Embedded texture is not supported");
			else
				attr_list.push_back({"url", string("\"") + tstring.C_Str() + "\""});
		}

		// repeatS="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatS", tvalb);

		// repeatT="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatT", tvalb);

		NodeHelper_OpenNode("ImageTexture", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "ImageTexture" node. END.

	//
	// "TextureTransform" node.
	//
	{
		auto Vec2ToAttrList = [&](const string& pAttrName, const aiVector2D& pAttrValue, const aiVector2D& pAttrDefaultValue)
		{
			string tstr;

			if(pAttrValue != pAttrDefaultValue)
			{
				AttrHelper_Vec2DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		aiUVTransform transform;

		if(material.Get(AI_MATKEY_UVTRANSFORM_DIFFUSE(0), transform) == AI_SUCCESS)
		{
			Vec2ToAttrList("translation", transform.mTranslation, aiVector2D(0, 0));
			AttrHelper_FloatToAttrList(attr_list, "rotation", transform.mRotation, 0);
			Vec2ToAttrList("scale", transform.mScaling, aiVector2D(1, 1));

			NodeHelper_OpenNode("TextureTransform", pTabLevel + 1, true, attr_list);
			attr_list.clear();
		}
	}// "TextureTransform" node. END.

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_A, pTabLevel);

}